

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

Sint64 RWops12to20_size(SDL_RWops *rwops20)

{
  Uint8 *pUVar1;
  int iVar2;
  int iVar3;
  Sint64 SVar4;
  
  iVar2 = (int)*(undefined8 *)((long)&rwops20->hidden + 8);
  if (iVar2 == -1) {
    pUVar1 = (rwops20->hidden).mem.base;
    iVar2 = (**(code **)pUVar1)(pUVar1,0,1);
    if (iVar2 == -1) {
      iVar2 = (*SDL20_Error)(SDL_EFSEEK);
      SVar4 = (Sint64)iVar2;
    }
    else {
      iVar3 = (**(code **)pUVar1)(pUVar1,0,2);
      (**(code **)pUVar1)(pUVar1,iVar2,0);
      SVar4 = (Sint64)iVar3;
      *(Sint64 *)((long)&rwops20->hidden + 8) = SVar4;
    }
    return SVar4;
  }
  return (long)iVar2;
}

Assistant:

static Sint64 SDLCALL
RWops12to20_size(struct SDL_RWops *rwops20)
{
    SDL12_RWops *rwops12 = (SDL12_RWops *) rwops20->hidden.unknown.data1;
    int size = (int) ((intptr_t) rwops20->hidden.unknown.data2);
    int pos;

    if (size != -1) {
        return size;
    }

    pos = rwops12->seek(rwops12, 0, RW_SEEK_CUR);
    if (pos == -1) {
        return SDL20_Error(SDL_EFSEEK);
    }
    size = rwops12->seek(rwops12, 0, RW_SEEK_END);
    rwops12->seek(rwops12, pos, RW_SEEK_SET);
    rwops20->hidden.unknown.data2 = (void *) ((intptr_t) size);
    return size;
}